

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_async_function_free(JSRuntime *rt,JSAsyncFunctionData *s)

{
  list_head *plVar1;
  list_head *plVar2;
  
  (s->header).ref_count = (s->header).ref_count + -1;
  if ((s->header).ref_count != 0) {
    return;
  }
  js_async_function_terminate(rt,s);
  JS_FreeValueRT(rt,s->resolving_funcs[0]);
  JS_FreeValueRT(rt,s->resolving_funcs[1]);
  plVar1 = (s->header).link.prev;
  plVar2 = (s->header).link.next;
  plVar1->next = plVar2;
  plVar2->prev = plVar1;
  (s->header).link.prev = (list_head *)0x0;
  (s->header).link.next = (list_head *)0x0;
  (*(rt->mf).js_free)(&rt->malloc_state,s);
  return;
}

Assistant:

static void js_async_function_free(JSRuntime *rt, JSAsyncFunctionData *s)
{
    if (--s->header.ref_count == 0) {
        js_async_function_free0(rt, s);
    }
}